

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hyb_gga_xc_b3lyp.c
# Opt level: O2

void xc_hyb_gga_xc_wp04_init(xc_func_type *p)

{
  double local_28 [4];
  
  local_28[0] = 0.03849999999999998;
  local_28[1] = 0.9614;
  local_28[2] = 0.9998;
  local_28[3] = 0.0001;
  xc_mix_init(p,4,xc_hyb_gga_xc_wp04_init::funcs_id,local_28);
  xc_hyb_init_hybrid(p,0.1189);
  return;
}

Assistant:

void
xc_hyb_gga_xc_wp04_init(xc_func_type *p)
{
  /* From the paper it is not clear if the LSDA is VWN or VWN_RPA.
     Due to the comparison to B3LYP I think the latter is more likely */
  const double PP[5] = {0.1189, 0.9614, 0.9999, 0.0001, 0.9999};
  static int funcs_id[4] = {XC_LDA_X, XC_GGA_X_B88, XC_LDA_C_VWN_RPA, XC_GGA_C_LYP};
  double funcs_coef[4];

  funcs_coef[0] = PP[2] - PP[1];
  funcs_coef[1] = PP[1];
  funcs_coef[2] = PP[4] - PP[3];
  funcs_coef[3] = PP[3];

  xc_mix_init(p, 4, funcs_id, funcs_coef);
  xc_hyb_init_hybrid(p, PP[0]);
}